

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QControlledGate2.cpp
# Opt level: O3

void __thiscall
qclab::qgates::QControlledGate2<std::complex<double>_>::apply
          (QControlledGate2<std::complex<double>_> *this,Op op,int nbQubits,
          vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *vector,int offset)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 in_register_00000084;
  complex<double> *vector_00;
  vector<int,_std::allocator<int>_> qubits;
  anon_class_72_5_b506d461 f;
  undefined1 local_a0 [8];
  void *local_98;
  int *local_90 [2];
  long local_80;
  anon_class_72_5_b506d461 local_78;
  
  vector_00 = (complex<double> *)CONCAT44(in_register_00000084,offset);
  (*(this->super_QGate2<std::complex<double>_>).super_QObject<std::complex<double>_>._vptr_QObject
    [5])(local_90,this);
  *(ulong *)local_90[0] =
       CONCAT44(offset + (int)((ulong)*(undefined8 *)local_90[0] >> 0x20),
                offset + (int)*(undefined8 *)local_90[0]);
  iVar1 = this->control_;
  iVar2 = (*(this->super_QGate2<std::complex<double>_>).super_QObject<std::complex<double>_>.
            _vptr_QObject[0xf])(this);
  iVar3 = (*(this->super_QGate2<std::complex<double>_>).super_QObject<std::complex<double>_>.
            _vptr_QObject[0x10])(this);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x38))
            (local_a0,(long *)CONCAT44(extraout_var,iVar3));
  lambda_QGate1<std::complex<double>>
            (&local_78,(qgates *)(ulong)(uint)(int)(char)op,(Op)local_a0,
             (SquareMatrix<std::complex<double>_> *)
             (vector->
             super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
             _M_impl.super__Vector_impl_data._M_start,vector_00);
  if (local_98 != (void *)0x0) {
    operator_delete__(local_98);
  }
  local_98 = (void *)0x0;
  apply4<qclab::qgates::lambda_QGate1<std::complex<double>>(qclab::Op,qclab::dense::SquareMatrix<std::complex<double>>,std::complex<double>*)::_lambda(unsigned_long,unsigned_long)_1_>
            (nbQubits,*local_90[0],local_90[0][1],iVar1 + offset,iVar2 + offset,this->controlState_,
             &local_78);
  if (local_90[0] != (int *)0x0) {
    operator_delete(local_90[0],local_80 - (long)local_90[0]);
  }
  return;
}

Assistant:

void QControlledGate2< T >::apply( Op op ,
                                     const int nbQubits ,
                                     std::vector< T >& vector ,
                                     const int offset ) const {
    auto qubits = this->qubits() ;
    qubits[0] += offset ;
    qubits[1] += offset ;
    const int control = this->control() + offset ;
    const int target  = this->target()  + offset ;
    auto f = lambda_QGate1( op , this->gate()->matrix() , vector.data() ) ;
    apply4( nbQubits , qubits[0] , qubits[1] , control , target ,
            this->controlState() , f ) ;
  }